

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  protobuf pVar1;
  byte bVar2;
  protobuf pVar3;
  uint uVar4;
  bool bVar5;
  LogMessage *pLVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  LogFinisher local_a1;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  LogMessage local_60;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x519);
    pLVar6 = internal::LogMessage::operator<<(&local_60,"CHECK failed: value != nullptr: ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_a1,pLVar6);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((char *)0x4 < s1.length_ + -1) goto switchD_0039cc2e_caseD_2;
  uVar7 = (long)&switchD_0039cc2e::switchdataD_003e859c +
          (long)(int)(&switchD_0039cc2e::switchdataD_003e859c)[(long)(s1.length_ + -1)];
  switch(s1.length_) {
  case (char *)0x1:
switchD_0039cc2e_caseD_1:
    pcVar9 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar9];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar9[0x3dc8e9];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      uVar7 = (ulong)((byte)pVar3 - uVar4);
      if (pVar3 != SUB41(uVar4,0)) goto LAB_0039cc92;
      pcVar9 = pcVar9 + 1;
    } while (s1.length_ != pcVar9);
    uVar7 = 0;
LAB_0039cc92:
    if ((int)uVar7 == 0) goto LAB_0039cfa4;
    if (s1.length_ == (char *)0x1) {
LAB_0039cdc4:
      pcVar9 = (char *)0x0;
      do {
        pVar1 = this[(long)pcVar9];
        pVar3 = (protobuf)((char)pVar1 + 0x20);
        if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
          pVar3 = pVar1;
        }
        bVar2 = pcVar9[0x3c162b];
        uVar4 = bVar2 + 0x20 & 0xff;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          uVar4 = (uint)bVar2;
        }
        iVar8 = (byte)pVar3 - uVar4;
        if (pVar3 != SUB41(uVar4,0)) goto LAB_0039ce26;
        pcVar9 = pcVar9 + 1;
      } while (s1.length_ != pcVar9);
      iVar8 = 0;
LAB_0039ce26:
      uVar7 = CONCAT71((int7)((ulong)pcVar9 >> 8),1);
      if (iVar8 == 0) goto LAB_0039cfa6;
      if (s1.length_ == (char *)0x5) goto switchD_0039cc2e_caseD_5;
      if (s1.length_ == (char *)0x1) {
        lVar10 = 0;
        do {
          pVar1 = this[lVar10];
          pVar3 = (protobuf)((char)pVar1 + 0x20);
          if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
            pVar3 = pVar1;
          }
          bVar2 = "inShape.heightRange().minimumValue() == 1"[lVar10 + 0x28];
          uVar4 = bVar2 + 0x20 & 0xff;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            uVar4 = (uint)bVar2;
          }
          iVar8 = (byte)pVar3 - uVar4;
          if (pVar3 != SUB41(uVar4,0)) goto LAB_0039cea4;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 1);
        iVar8 = 0;
LAB_0039cea4:
        if (iVar8 == 0) goto LAB_0039cfa6;
      }
    }
    else {
      if (s1.length_ == (char *)0x5) goto switchD_0039cc2e_caseD_5;
      if (s1.length_ == (char *)0x3) goto switchD_0039cc2e_caseD_3;
    }
    break;
  case (char *)0x3:
switchD_0039cc2e_caseD_3:
    pcVar9 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar9];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar9[0x3e8d3c];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      uVar7 = (ulong)((byte)pVar3 - uVar4);
      if (pVar3 != SUB41(uVar4,0)) goto LAB_0039cda8;
      pcVar9 = pcVar9 + 1;
    } while (s1.length_ != pcVar9);
    uVar7 = 0;
LAB_0039cda8:
    if ((int)uVar7 == 0) {
LAB_0039cfa4:
      uVar7 = 1;
      goto LAB_0039cfa6;
    }
    if (s1.length_ == (char *)0x5) goto switchD_0039cc2e_caseD_5;
    if (s1.length_ == (char *)0x1) goto LAB_0039cdc4;
    break;
  case (char *)0x4:
    pcVar9 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar9];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar9[0x3da6cd];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      uVar7 = (ulong)((byte)pVar3 - uVar4);
      if (pVar3 != SUB41(uVar4,0)) goto LAB_0039cd1f;
      pcVar9 = pcVar9 + 1;
    } while (s1.length_ != pcVar9);
    uVar7 = 0;
LAB_0039cd1f:
    if ((int)uVar7 == 0) goto LAB_0039cfa4;
    if (s1.length_ == (char *)0x5) goto switchD_0039cc2e_caseD_5;
    if (s1.length_ == (char *)0x3) goto switchD_0039cc2e_caseD_3;
    if (s1.length_ == (char *)0x1) goto switchD_0039cc2e_caseD_1;
    break;
  case (char *)0x5:
switchD_0039cc2e_caseD_5:
    pcVar9 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar9];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      uVar11 = uVar7 & 0xffffffff;
      bVar2 = pcVar9[0x3e2917];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      bVar5 = pVar3 != SUB41(uVar4,0);
      uVar7 = (ulong)((byte)pVar3 - uVar4);
      if (!bVar5) {
        uVar7 = uVar11;
      }
      iVar8 = (int)uVar7;
      if (bVar5) goto LAB_0039cf14;
      pcVar9 = pcVar9 + 1;
    } while (s1.length_ != pcVar9);
    iVar8 = 0;
LAB_0039cf14:
    if (iVar8 != 0) break;
    goto LAB_0039cfa0;
  }
switchD_0039cc2e_caseD_2:
  stringpiece_internal::StringPiece::StringPiece(&local_70,"f");
  s1.ptr_ = (char *)this;
  bVar5 = CaseEqual(s1,local_70);
  if (!bVar5) {
    stringpiece_internal::StringPiece::StringPiece(&local_80,"no");
    s1_00.length_ = (size_type)s1.length_;
    s1_00.ptr_ = (char *)this;
    bVar5 = CaseEqual(s1_00,local_80);
    if (!bVar5) {
      stringpiece_internal::StringPiece::StringPiece(&local_90,"n");
      s1_01.length_ = (size_type)s1.length_;
      s1_01.ptr_ = (char *)this;
      bVar5 = CaseEqual(s1_01,local_90);
      if (!bVar5) {
        stringpiece_internal::StringPiece::StringPiece(&local_a0,"0");
        s1_02.length_ = (size_type)s1.length_;
        s1_02.ptr_ = (char *)this;
        bVar5 = CaseEqual(s1_02,local_a0);
        uVar7 = 0;
        if (!bVar5) {
          return false;
        }
        goto LAB_0039cfa6;
      }
    }
  }
LAB_0039cfa0:
  uVar7 = 0;
LAB_0039cfa6:
  *(undefined1 *)str.length_ = (char)uVar7;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}